

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O1

void R_3D_NewClip(void)

{
  F3DFloor *pFVar1;
  ClipStack *__dest;
  ClipStack **ppCVar2;
  ClipStack **ppCVar3;
  
  __dest = (ClipStack *)
           M_Malloc_Dbg(0x5a10,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_3dfloors.cpp"
                        ,0x61);
  __dest->next = (ClipStack *)0x0;
  memcpy(__dest,floorclip,0x2d00);
  memcpy(__dest->ceilingclip,ceilingclip,0x2d00);
  pFVar1 = fakeFloor;
  __dest->ffloor = fakeFloor;
  if (pFVar1->floorclip != (short *)0x0) {
    __assert_fail("fakeFloor->floorclip == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_3dfloors.cpp"
                  ,0x66,"void R_3D_NewClip()");
  }
  if (pFVar1->ceilingclip != (short *)0x0) {
    __assert_fail("fakeFloor->ceilingclip == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_3dfloors.cpp"
                  ,0x67,"void R_3D_NewClip()");
  }
  pFVar1->floorclip = (short *)__dest;
  pFVar1->ceilingclip = __dest->ceilingclip;
  ppCVar2 = &clip_cur->next;
  ppCVar3 = &clip_top;
  if (clip_top == (ClipStack *)0x0) {
    ppCVar2 = &clip_cur;
  }
  else {
    ppCVar3 = &clip_cur;
  }
  *ppCVar2 = __dest;
  *ppCVar3 = __dest;
  return;
}

Assistant:

void R_3D_NewClip()
{
	ClipStack *curr;
//	extern short floorclip[MAXWIDTH];
//	extern short ceilingclip[MAXWIDTH];

	curr = (ClipStack*)M_Malloc(sizeof(ClipStack));
	curr->next = 0;
	memcpy(curr->floorclip, floorclip, sizeof(short) * MAXWIDTH);
	memcpy(curr->ceilingclip, ceilingclip, sizeof(short) * MAXWIDTH);
	curr->ffloor = fakeFloor;
	assert(fakeFloor->floorclip == NULL);
	assert(fakeFloor->ceilingclip == NULL);
	fakeFloor->floorclip = curr->floorclip;
	fakeFloor->ceilingclip = curr->ceilingclip;
	if(clip_top) {
		clip_cur->next = curr;
		clip_cur = curr;
	} else {
		clip_top = clip_cur = curr;
	}
}